

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data,char *str,int stringSize)

{
  size_t sVar1;
  int in_EDX;
  char *in_RSI;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  HelicsDataBuffer in_stack_ffffffffffffffa8;
  SmallBuffer *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  SmallBuffer *local_28;
  int local_1c;
  char *local_18;
  int32_t local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_28 = getBuffer(in_stack_ffffffffffffffa8);
  if (local_28 == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,local_18,(long)local_1c);
    helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar1 = helics::SmallBuffer::size(local_28);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data, const char* str, int stringSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str, stringSize), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}